

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O2

int mtar_write_header(mtar_t *tar,mtar_header_t *h)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  mtar_raw_header_t rh;
  
  if (h->size >> 0x21 == 0) {
    memset(&rh,0,0x200);
    sprintf(rh.mode,"%o",(ulong)h->mode);
    sprintf(rh.owner,"%o",(ulong)h->owner);
    sprintf(rh.size,"%llo",h->size);
    sprintf(rh.mtime,"%o",(ulong)h->mtime);
    rh.type = '0';
    if (h->type != 0) {
      rh.type = (char)h->type;
    }
    sVar3 = strlen(h->name);
    if (sVar3 < 100) {
      sVar3 = strlen(h->linkname);
      if (sVar3 < 100) {
        strcpy(rh.name,h->name);
        strcpy(rh.linkname,h->linkname);
        uVar1 = mtar_checksum(&rh);
        sprintf(rh.checksum,"%06o",(ulong)uVar1);
        rh.checksum[7] = ' ';
      }
    }
  }
  tar->remaining_data = h->size;
  iVar2 = (*tar->write)(tar,&rh,0x200);
  tar->pos = tar->pos + 0x200;
  return iVar2;
}

Assistant:

int mtar_write_header(mtar_t *tar, const mtar_header_t *h) {
  mtar_raw_header_t rh;
  /* Build raw header and write */
  mtar_header_to_raw(&rh, h);
  tar->remaining_data = h->size;
  return mtar_twrite(tar, &rh, sizeof(rh));
}